

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O0

void __thiscall
EfcFlash::EfcFlash(EfcFlash *this,Samba *samba,string *name,uint32_t addr,uint32_t pages,
                  uint32_t size,uint32_t planes,uint32_t lockRegions,uint32_t user,uint32_t stack,
                  bool canBootFlash)

{
  bool canBootFlash_local;
  uint32_t size_local;
  uint32_t pages_local;
  uint32_t addr_local;
  string *name_local;
  Samba *samba_local;
  EfcFlash *this_local;
  
  Flash::Flash(&this->super_Flash,samba,name,addr,pages,size,planes,lockRegions,user,stack);
  (this->super_Flash)._vptr_Flash = (_func_int **)&PTR__EfcFlash_00128a30;
  (this->super_Flash).field_0xf4 = canBootFlash;
  if (planes != 1 && planes != 2) {
    __assert_fail("planes == 1 || planes == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EfcFlash.cpp"
                  ,0x43,
                  "EfcFlash::EfcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
                 );
  }
  if (pages <= planes << 10) {
    if (lockRegions < 0x21) {
      (*(this->super_Flash)._vptr_Flash[9])(this,1);
      return;
    }
    __assert_fail("lockRegions <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EfcFlash.cpp"
                  ,0x45,
                  "EfcFlash::EfcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
                 );
  }
  __assert_fail("pages <= planes * 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EfcFlash.cpp"
                ,0x44,
                "EfcFlash::EfcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
               );
}

Assistant:

EfcFlash::EfcFlash(Samba& samba,
                   const std::string& name,
                   uint32_t addr,
                   uint32_t pages,
                   uint32_t size,
                   uint32_t planes,
                   uint32_t lockRegions,
                   uint32_t user,
                   uint32_t stack,
                   bool canBootFlash)
    : Flash(samba, name, addr, pages, size, planes, lockRegions, user, stack),
      _canBootFlash(canBootFlash)
{
    assert(planes == 1 || planes == 2);
    assert(pages <= planes * 1024);
    assert(lockRegions <= 32);

    eraseAuto(true);
}